

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_stbvorbis_seek_to_pcm_frame(ma_stbvorbis *pVorbis,ma_uint64 frameIndex)

{
  ma_result mVar1;
  int iVar2;
  ulong in_RSI;
  long in_RDI;
  int vorbisResult;
  ma_uint64 framesToRead;
  ma_uint64 framesRead;
  float buffer [4096];
  ma_result result;
  ma_allocation_callbacks *in_stack_ffffffffffffbfa8;
  undefined4 in_stack_ffffffffffffbfb0;
  uint in_stack_ffffffffffffbfb4;
  stb_vorbis *in_stack_ffffffffffffbfb8;
  ma_stbvorbis *in_stack_ffffffffffffbfe8;
  ma_uint64 *in_stack_ffffffffffffc020;
  ma_uint64 in_stack_ffffffffffffc028;
  void *in_stack_ffffffffffffc030;
  ma_stbvorbis *in_stack_ffffffffffffc038;
  ma_result local_14;
  
  if (in_RDI == 0) {
    local_14 = MA_INVALID_ARGS;
  }
  else if (*(int *)(in_RDI + 0xa8) == 0) {
    if (in_RSI < 0x100000000) {
      iVar2 = stb_vorbis_seek(in_stack_ffffffffffffbfb8,in_stack_ffffffffffffbfb4);
      if (iVar2 == 0) {
        local_14 = MA_ERROR;
      }
      else {
        *(ulong *)(in_RDI + 0x98) = in_RSI;
LAB_001ef007:
        local_14 = MA_SUCCESS;
      }
    }
    else {
      local_14 = MA_INVALID_ARGS;
    }
  }
  else {
    if (in_RSI < *(ulong *)(in_RDI + 0x98)) {
      if (0x7fffffff < in_RSI) {
        return MA_INVALID_ARGS;
      }
      stb_vorbis_close((stb_vorbis *)0x1eede6);
      ma_free((void *)CONCAT44(in_stack_ffffffffffffbfb4,in_stack_ffffffffffffbfb0),
              in_stack_ffffffffffffbfa8);
      if ((void *)(in_RDI + 0xb0) != (void *)0x0) {
        memset((void *)(in_RDI + 0xb0),0,0x30);
      }
      mVar1 = (**(code **)(in_RDI + 0x50))(*(undefined8 *)(in_RDI + 0x60),0,0);
      if (mVar1 != MA_SUCCESS) {
        return mVar1;
      }
      mVar1 = ma_stbvorbis_init_internal_decoder_push(in_stack_ffffffffffffbfe8);
      if (mVar1 != MA_SUCCESS) {
        return mVar1;
      }
      *(undefined8 *)(in_RDI + 0x98) = 0;
    }
    do {
      if (in_RSI <= *(ulong *)(in_RDI + 0x98)) goto LAB_001ef007;
      local_14 = ma_stbvorbis_read_pcm_frames
                           (in_stack_ffffffffffffc038,in_stack_ffffffffffffc030,
                            in_stack_ffffffffffffc028,in_stack_ffffffffffffc020);
    } while (local_14 == MA_SUCCESS);
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_stbvorbis_seek_to_pcm_frame(ma_stbvorbis* pVorbis, ma_uint64 frameIndex)
{
    if (pVorbis == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_VORBIS)
    {
        /* Different seeking methods depending on whether or not we're using push mode. */
        if (pVorbis->usingPushMode) {
            /* Push mode. This is the complex case. */
            ma_result result;
            float buffer[4096];

            /* If we're seeking backwards, we need to seek back to the start and then brute-force forward. */
            if (frameIndex < pVorbis->cursor) {
                if (frameIndex > 0x7FFFFFFF) {
                    return MA_INVALID_ARGS; /* Trying to seek beyond the 32-bit maximum of stb_vorbis. */
                }

                /*
                This is wildly inefficient due to me having trouble getting sample exact seeking working
                robustly with stb_vorbis_flush_pushdata(). The only way I can think to make this work
                perfectly is to reinitialize the decoder. Note that we only enter this path when seeking
                backwards. This will hopefully be removed once we get our own Vorbis decoder implemented.
                */
                stb_vorbis_close(pVorbis->stb);
                ma_free(pVorbis->push.pData, &pVorbis->allocationCallbacks);

                MA_ZERO_OBJECT(&pVorbis->push);

                /* Seek to the start of the file. */
                result = pVorbis->onSeek(pVorbis->pReadSeekTellUserData, 0, ma_seek_origin_start);
                if (result != MA_SUCCESS) {
                    return result;
                }

                result = ma_stbvorbis_init_internal_decoder_push(pVorbis);
                if (result != MA_SUCCESS) {
                    return result;
                }

                /* At this point we should be sitting on the first frame. */
                pVorbis->cursor = 0;
            }

            /* We're just brute-forcing this for now. */
            while (pVorbis->cursor < frameIndex) {
                ma_uint64 framesRead;
                ma_uint64 framesToRead = ma_countof(buffer)/pVorbis->channels;
                if (framesToRead > (frameIndex - pVorbis->cursor)) {
                    framesToRead = (frameIndex - pVorbis->cursor);
                }

                result = ma_stbvorbis_read_pcm_frames(pVorbis, buffer, framesToRead, &framesRead);
                if (result != MA_SUCCESS) {
                    return result;
                }
            }
        } else {
            /* Pull mode. This is the simple case. */
            int vorbisResult;

            if (frameIndex > UINT_MAX) {
                return MA_INVALID_ARGS; /* Trying to seek beyond the 32-bit maximum of stb_vorbis. */
            }

            vorbisResult = stb_vorbis_seek(pVorbis->stb, (unsigned int)frameIndex);  /* Safe cast. */
            if (vorbisResult == 0) {
                return MA_ERROR;    /* See failed. */
            }

            pVorbis->cursor = frameIndex;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* vorbis is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)frameIndex;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}